

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

int32_t uchar_swapNames_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                          UErrorCode *pErrorCode)

{
  byte bVar1;
  UDataSwapFn *pUVar2;
  UBool UVar3;
  uint16_t uVar4;
  int16_t iVar5;
  uint16_t tokenCount_00;
  int32_t iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t *__src;
  uint32_t *__dest;
  void *pvVar10;
  uint8_t *puVar11;
  void *pvVar12;
  size_t sVar13;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  uint32_t factorsCount;
  uint8_t c;
  uint8_t *outStrings;
  uint8_t *nextInStrings;
  uint8_t *inStrings;
  uint16_t lengths [33];
  uint16_t local_708 [4];
  uint16_t offsets [33];
  byte local_6b8 [8];
  uint8_t trailMap [256];
  uint8_t map [256];
  int16_t local_4a8 [3];
  uint16_t tokenCount;
  int16_t tokens [512];
  uint16_t *temp;
  uint16_t *q;
  uint16_t *p;
  AlgorithmicRange *outRange;
  AlgorithmicRange *inRange;
  uint32_t stringsCount;
  uint32_t count;
  uint32_t i;
  uint32_t offset;
  uint32_t algNamesOffset;
  uint32_t groupStringOffset;
  uint32_t groupsOffset;
  uint32_t tokenStringOffset;
  uint8_t *outBytes;
  uint8_t *inBytes;
  int32_t headerSize;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  iVar6 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar3 = U_FAILURE(*pErrorCode), UVar3 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if ((((*(char *)((long)inData + 0xc) == 'u') && (*(char *)((long)inData + 0xd) == 'n')) &&
           (*(char *)((long)inData + 0xe) == 'a')) &&
          ((*(char *)((long)inData + 0xf) == 'm' && (*(char *)((long)inData + 0x10) == '\x01')))) {
    __src = (uint32_t *)((long)inData + (long)iVar6);
    __dest = (uint32_t *)((long)outData + (long)iVar6);
    if (length < 0) {
      i = (*ds->readUInt32)(__src[3]);
      outData_local._4_4_ = length;
    }
    else {
      outData_local._4_4_ = length - iVar6;
      if (((int)outData_local._4_4_ < 0x14) ||
         (i = (*ds->readUInt32)(__src[3]), outData_local._4_4_ < i)) {
        udata_printError_63(ds,"uchar_swapNames(): too few bytes (%d after header) for unames.icu\n"
                            ,(ulong)outData_local._4_4_);
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
    }
    if ((int)outData_local._4_4_ < 0) {
      uVar7 = (*ds->readUInt32)(*(uint32_t *)((long)__src + (ulong)i));
      count = i + 4;
      for (stringsCount = 0; stringsCount < uVar7; stringsCount = stringsCount + 1) {
        uVar4 = (*ds->readUInt16)(*(uint16_t *)((long)__src + (ulong)count + 10));
        count = uVar4 + count;
      }
    }
    else {
      if (__src != __dest) {
        memcpy(__dest,__src,(long)(int)outData_local._4_4_);
      }
      uVar7 = (*ds->readUInt32)(*__src);
      uVar8 = (*ds->readUInt32)(__src[1]);
      uVar9 = (*ds->readUInt32)(__src[2]);
      (*ds->swapArray32)(ds,__src,0x10,__dest,pErrorCode);
      uVar4 = (*ds->readUInt16)((uint16_t)__src[4]);
      (*ds->swapArray16)(ds,__src + 4,2,__dest + 4,pErrorCode);
      if (uVar4 < 0x201) {
        inRange._4_4_ = (uint)uVar4;
      }
      else {
        inRange._4_4_ = 0x200;
      }
      for (stringsCount = 0; stringsCount < inRange._4_4_; stringsCount = stringsCount + 1) {
        iVar5 = udata_readInt16_63(ds,*(int16_t *)((long)__src + (ulong)stringsCount * 2 + 0x12));
        local_4a8[stringsCount] = iVar5;
      }
      for (; stringsCount < 0x200; stringsCount = stringsCount + 1) {
        local_4a8[stringsCount] = 0;
      }
      makeTokenMap(ds,local_4a8,uVar4,trailMap + 0xf8,pErrorCode);
      if (uVar4 < 0x101) {
        tokenCount_00 = 0;
      }
      else {
        tokenCount_00 = uVar4 - 0x100;
      }
      makeTokenMap(ds,tokens + 0xfc,tokenCount_00,local_6b8,pErrorCode);
      UVar3 = U_FAILURE(*pErrorCode);
      if (UVar3 != '\0') {
        return 0;
      }
      pvVar10 = uprv_malloc_63((long)(int)((uint)uVar4 << 1));
      if (pvVar10 == (void *)0x0) {
        udata_printError_63(ds,"out of memory swapping %u unames.icu tokens\n",(ulong)uVar4);
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        return 0;
      }
      for (stringsCount = 0; stringsCount < uVar4 && stringsCount < 0x100;
          stringsCount = stringsCount + 1) {
        (*ds->swapArray16)(ds,(void *)((long)__src + (ulong)stringsCount * 2 + 0x12),2,
                           (void *)((long)pvVar10 +
                                   (long)(int)(uint)trailMap[(ulong)stringsCount + 0xf8] * 2),
                           pErrorCode);
      }
      for (; stringsCount < uVar4; stringsCount = stringsCount + 1) {
        (*ds->swapArray16)(ds,(void *)((long)__src + (ulong)stringsCount * 2 + 0x12),2,
                           (void *)((long)pvVar10 +
                                   (long)(int)(uint)local_6b8[stringsCount & 0xff] * 2 +
                                   (ulong)(stringsCount & 0xffffff00) * 2),pErrorCode);
      }
      memcpy((void *)((long)__dest + 0x12),pvVar10,(long)(int)((uint)uVar4 << 1));
      uprv_free_63(pvVar10);
      udata_swapInvStringBlock_63
                (ds,(void *)((long)__src + (ulong)uVar7),uVar8 - uVar7,
                 (void *)((long)__dest + (ulong)uVar7),pErrorCode);
      UVar3 = U_FAILURE(*pErrorCode);
      if (UVar3 != '\0') {
        udata_printError_63(ds,"uchar_swapNames(token strings) failed\n");
        return 0;
      }
      uVar4 = (*ds->readUInt16)(*(uint16_t *)((long)__src + (ulong)uVar8));
      (*ds->swapArray16)(ds,(void *)((long)__src + (ulong)uVar8),((uint)uVar4 * 3 + 1) * 2,
                         (void *)((long)__dest + (ulong)uVar8),pErrorCode);
      if (ds->inCharset != ds->outCharset) {
        nextInStrings = (uint8_t *)((long)__src + (ulong)uVar9);
        _factorsCount = (byte *)((long)__dest + (ulong)uVar9);
        inRange._0_4_ = i - uVar9;
        while (0x20 < (uint)inRange) {
          puVar11 = icu_63::expandGroupLengths(nextInStrings,local_708,(uint16_t *)&inStrings);
          inRange._4_4_ = (uint)offsets[0x1b] + (uint)lengths[0x1b];
          inRange._0_4_ = ((uint)inRange - ((int)puVar11 - (int)nextInStrings)) - inRange._4_4_;
          _factorsCount = _factorsCount + ((long)puVar11 - (long)nextInStrings);
          nextInStrings = puVar11;
          while (inRange._4_4_ != 0) {
            pbVar14 = nextInStrings + 1;
            bVar1 = *nextInStrings;
            pbVar15 = _factorsCount + 1;
            *_factorsCount = trailMap[(ulong)bVar1 + 0xf8];
            if (local_4a8[bVar1] == -2) {
              nextInStrings = nextInStrings + 2;
              _factorsCount = _factorsCount + 2;
              *pbVar15 = local_6b8[*pbVar14];
              inRange._4_4_ = inRange._4_4_ + -2;
            }
            else {
              inRange._4_4_ = inRange._4_4_ + -1;
              _factorsCount = pbVar15;
              nextInStrings = pbVar14;
            }
          }
        }
      }
      uVar7 = (*ds->readUInt32)(*(uint32_t *)((long)__src + (ulong)i));
      (*ds->swapArray32)(ds,(void *)((long)__src + (ulong)i),4,(void *)((long)__dest + (ulong)i),
                         pErrorCode);
      count = i + 4;
      for (stringsCount = 0; stringsCount < uVar7; stringsCount = stringsCount + 1) {
        if (outData_local._4_4_ < count) {
          udata_printError_63(ds,
                              "uchar_swapNames(): too few bytes (%d after header) for unames.icu algorithmic range %u\n"
                              ,(ulong)outData_local._4_4_,(ulong)stringsCount);
          *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
        pvVar10 = (void *)((long)__src + (ulong)count);
        pvVar12 = (void *)((long)__dest + (ulong)count);
        uVar4 = (*ds->readUInt16)(*(uint16_t *)((long)pvVar10 + 10));
        count = count + uVar4;
        (*ds->swapArray32)(ds,pvVar10,8,pvVar12,pErrorCode);
        (*ds->swapArray16)(ds,(void *)((long)pvVar10 + 10),2,(void *)((long)pvVar12 + 10),pErrorCode
                          );
        if (*(char *)((long)pvVar10 + 8) == '\0') {
          pUVar2 = ds->swapInvChars;
          sVar13 = strlen((char *)((long)pvVar10 + 0xc));
          (*pUVar2)(ds,(void *)((long)pvVar10 + 0xc),(int32_t)sVar13,(void *)((long)pvVar12 + 0xc),
                    pErrorCode);
          UVar3 = U_FAILURE(*pErrorCode);
          if (UVar3 != '\0') {
            udata_printError_63(ds,"uchar_swapNames(prefix string of algorithmic range %u) failed\n"
                                ,(ulong)stringsCount);
            return 0;
          }
        }
        else {
          if (*(char *)((long)pvVar10 + 8) != '\x01') {
            udata_printError_63(ds,"uchar_swapNames(): unknown type %u of algorithmic range %u\n",
                                (ulong)*(byte *)((long)pvVar10 + 8),(ulong)stringsCount);
            *pErrorCode = U_UNSUPPORTED_ERROR;
            return 0;
          }
          bVar1 = *(byte *)((long)pvVar10 + 9);
          (*ds->swapArray16)(ds,(void *)((long)pvVar10 + 0xc),(uint)bVar1 << 1,
                             (void *)((long)pvVar12 + 0xc),pErrorCode);
          pvVar10 = (void *)((long)pvVar10 + 0xc + (ulong)(uint)bVar1 * 2);
          inRange._0_4_ = ((int)__src + count) - (int)pvVar10;
          while( true ) {
            bVar16 = false;
            if ((uint)inRange != 0) {
              bVar16 = *(char *)((long)pvVar10 + (ulong)((uint)inRange - 1)) != '\0';
            }
            if (!bVar16) break;
            inRange._0_4_ = (uint)inRange + -1;
          }
          (*ds->swapInvChars)(ds,pvVar10,(uint)inRange,
                              (void *)((long)pvVar12 + 0xc + (ulong)(uint)bVar1 * 2),pErrorCode);
        }
      }
    }
    ds_local._4_4_ = iVar6 + count;
  }
  else {
    udata_printError_63(ds,
                        "uchar_swapNames(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unames.icu\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uchar_swapNames(const UDataSwapper *ds,
                const void *inData, int32_t length, void *outData,
                UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    uint32_t tokenStringOffset, groupsOffset, groupStringOffset, algNamesOffset,
             offset, i, count, stringsCount;

    const AlgorithmicRange *inRange;
    AlgorithmicRange *outRange;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x75 &&   /* dataFormat="unam" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x61 &&
        pInfo->dataFormat[3]==0x6d &&
        pInfo->formatVersion[0]==1
    )) {
        udata_printError(ds, "uchar_swapNames(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unames.icu\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;
    if(length<0) {
        algNamesOffset=ds->readUInt32(((const uint32_t *)inBytes)[3]);
    } else {
        length-=headerSize;
        if( length<20 ||
            (uint32_t)length<(algNamesOffset=ds->readUInt32(((const uint32_t *)inBytes)[3]))
        ) {
            udata_printError(ds, "uchar_swapNames(): too few bytes (%d after header) for unames.icu\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    if(length<0) {
        /* preflighting: iterate through algorithmic ranges */
        offset=algNamesOffset;
        count=ds->readUInt32(*((const uint32_t *)(inBytes+offset)));
        offset+=4;

        for(i=0; i<count; ++i) {
            inRange=(const AlgorithmicRange *)(inBytes+offset);
            offset+=ds->readUInt16(inRange->size);
        }
    } else {
        /* swap data */
        const uint16_t *p;
        uint16_t *q, *temp;

        int16_t tokens[512];
        uint16_t tokenCount;

        uint8_t map[256], trailMap[256];

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, length);
        }

        /* the initial 4 offsets first */
        tokenStringOffset=ds->readUInt32(((const uint32_t *)inBytes)[0]);
        groupsOffset=ds->readUInt32(((const uint32_t *)inBytes)[1]);
        groupStringOffset=ds->readUInt32(((const uint32_t *)inBytes)[2]);
        ds->swapArray32(ds, inBytes, 16, outBytes, pErrorCode);

        /*
         * now the tokens table
         * it needs to be permutated along with the compressed name strings
         */
        p=(const uint16_t *)(inBytes+16);
        q=(uint16_t *)(outBytes+16);

        /* read and swap the tokenCount */
        tokenCount=ds->readUInt16(*p);
        ds->swapArray16(ds, p, 2, q, pErrorCode);
        ++p;
        ++q;

        /* read the first 512 tokens and make the token maps */
        if(tokenCount<=512) {
            count=tokenCount;
        } else {
            count=512;
        }
        for(i=0; i<count; ++i) {
            tokens[i]=udata_readInt16(ds, p[i]);
        }
        for(; i<512; ++i) {
            tokens[i]=0; /* fill the rest of the tokens array if tokenCount<512 */
        }
        makeTokenMap(ds, tokens, tokenCount, map, pErrorCode);
        makeTokenMap(ds, tokens+256, (uint16_t)(tokenCount>256 ? tokenCount-256 : 0), trailMap, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return 0;
        }

        /*
         * swap and permutate the tokens
         * go through a temporary array to support in-place swapping
         */
        temp=(uint16_t *)uprv_malloc(tokenCount*2);
        if(temp==NULL) {
            udata_printError(ds, "out of memory swapping %u unames.icu tokens\n",
                             tokenCount);
            *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }

        /* swap and permutate single-/lead-byte tokens */
        for(i=0; i<tokenCount && i<256; ++i) {
            ds->swapArray16(ds, p+i, 2, temp+map[i], pErrorCode);
        }

        /* swap and permutate trail-byte tokens */
        for(; i<tokenCount; ++i) {
            ds->swapArray16(ds, p+i, 2, temp+(i&0xffffff00)+trailMap[i&0xff], pErrorCode);
        }

        /* copy the result into the output and free the temporary array */
        uprv_memcpy(q, temp, tokenCount*2);
        uprv_free(temp);

        /*
         * swap the token strings but not a possible padding byte after
         * the terminating NUL of the last string
         */
        udata_swapInvStringBlock(ds, inBytes+tokenStringOffset, (int32_t)(groupsOffset-tokenStringOffset),
                                    outBytes+tokenStringOffset, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "uchar_swapNames(token strings) failed\n");
            return 0;
        }

        /* swap the group table */
        count=ds->readUInt16(*((const uint16_t *)(inBytes+groupsOffset)));
        ds->swapArray16(ds, inBytes+groupsOffset, (int32_t)((1+count*3)*2),
                           outBytes+groupsOffset, pErrorCode);

        /*
         * swap the group strings
         * swap the string bytes but not the nibble-encoded string lengths
         */
        if(ds->inCharset!=ds->outCharset) {
            uint16_t offsets[LINES_PER_GROUP+1], lengths[LINES_PER_GROUP+1];

            const uint8_t *inStrings, *nextInStrings;
            uint8_t *outStrings;

            uint8_t c;

            inStrings=inBytes+groupStringOffset;
            outStrings=outBytes+groupStringOffset;

            stringsCount=algNamesOffset-groupStringOffset;

            /* iterate through string groups until only a few padding bytes are left */
            while(stringsCount>32) {
                nextInStrings=expandGroupLengths(inStrings, offsets, lengths);

                /* move past the length bytes */
                stringsCount-=(uint32_t)(nextInStrings-inStrings);
                outStrings+=nextInStrings-inStrings;
                inStrings=nextInStrings;

                count=offsets[31]+lengths[31]; /* total number of string bytes in this group */
                stringsCount-=count;

                /* swap the string bytes using map[] and trailMap[] */
                while(count>0) {
                    c=*inStrings++;
                    *outStrings++=map[c];
                    if(tokens[c]!=-2) {
                        --count;
                    } else {
                        /* token lead byte: swap the trail byte, too */
                        *outStrings++=trailMap[*inStrings++];
                        count-=2;
                    }
                }
            }
        }

        /* swap the algorithmic ranges */
        offset=algNamesOffset;
        count=ds->readUInt32(*((const uint32_t *)(inBytes+offset)));
        ds->swapArray32(ds, inBytes+offset, 4, outBytes+offset, pErrorCode);
        offset+=4;

        for(i=0; i<count; ++i) {
            if(offset>(uint32_t)length) {
                udata_printError(ds, "uchar_swapNames(): too few bytes (%d after header) for unames.icu algorithmic range %u\n",
                                 length, i);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }

            inRange=(const AlgorithmicRange *)(inBytes+offset);
            outRange=(AlgorithmicRange *)(outBytes+offset);
            offset+=ds->readUInt16(inRange->size);

            ds->swapArray32(ds, inRange, 8, outRange, pErrorCode);
            ds->swapArray16(ds, &inRange->size, 2, &outRange->size, pErrorCode);
            switch(inRange->type) {
            case 0:
                /* swap prefix string */
                ds->swapInvChars(ds, inRange+1, (int32_t)uprv_strlen((const char *)(inRange+1)),
                                    outRange+1, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "uchar_swapNames(prefix string of algorithmic range %u) failed\n",
                                     i);
                    return 0;
                }
                break;
            case 1:
                {
                    /* swap factors and the prefix and factor strings */
                    uint32_t factorsCount;

                    factorsCount=inRange->variant;
                    p=(const uint16_t *)(inRange+1);
                    q=(uint16_t *)(outRange+1);
                    ds->swapArray16(ds, p, (int32_t)(factorsCount*2), q, pErrorCode);

                    /* swap the strings, up to the last terminating NUL */
                    p+=factorsCount;
                    q+=factorsCount;
                    stringsCount=(uint32_t)((inBytes+offset)-(const uint8_t *)p);
                    while(stringsCount>0 && ((const uint8_t *)p)[stringsCount-1]!=0) {
                        --stringsCount;
                    }
                    ds->swapInvChars(ds, p, (int32_t)stringsCount, q, pErrorCode);
                }
                break;
            default:
                udata_printError(ds, "uchar_swapNames(): unknown type %u of algorithmic range %u\n",
                                 inRange->type, i);
                *pErrorCode=U_UNSUPPORTED_ERROR;
                return 0;
            }
        }
    }

    return headerSize+(int32_t)offset;
}